

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Alt(Compiler *this,Frag a,Frag b)

{
  bool bVar1;
  uint32_t begin;
  Inst *pIVar2;
  PatchList PVar3;
  Frag FVar4;
  byte local_99;
  uint32_t local_78;
  bool bStack_74;
  undefined3 uStack_73;
  uint32_t local_70;
  bool bStack_6c;
  int id;
  Compiler *this_local;
  Frag b_local;
  Frag a_local;
  uint32_t local_10;
  uint32_t uStack_c;
  
  b_local.end.tail = a.begin;
  b_local._12_4_ = a.end.head;
  a_local.begin = a.end.tail;
  a_local.end.head = a._12_4_;
  this_local._0_4_ = b.begin;
  bVar1 = IsNoMatch(a);
  if (bVar1) {
    local_10 = b.end.tail;
    uStack_c = b._12_4_;
    a_local._8_8_ = b._0_8_;
  }
  else {
    bVar1 = IsNoMatch(b);
    if (bVar1) {
      local_10 = a_local.begin;
      uStack_c = a_local.end.head;
      a_local._8_8_ = a._0_8_;
    }
    else {
      begin = AllocInst(this,1);
      if ((int)begin < 0) {
        FVar4 = NoMatch(this);
        _local_78 = FVar4._0_8_;
        a_local.end.tail = local_78;
        a_local.nullable = bStack_74;
        a_local._13_3_ = uStack_73;
        local_70 = FVar4.end.tail;
        local_10 = local_70;
        bStack_6c = FVar4.nullable;
        uStack_c = CONCAT31(uStack_c._1_3_,bStack_6c);
      }
      else {
        pIVar2 = PODArray<re2::Prog::Inst>::operator[](&this->inst_,begin);
        Prog::Inst::InitAlt(pIVar2,b_local.end.tail,(uint32_t)this_local);
        pIVar2 = PODArray<re2::Prog::Inst>::data(&this->inst_);
        PVar3.tail = a_local.begin;
        PVar3.head = b_local._12_4_;
        PVar3 = PatchList::Append(pIVar2,PVar3,b.end);
        local_99 = 1;
        if ((a_local.end.head & 1) == 0) {
          b_local.end.head._0_1_ = b.nullable;
          local_99 = b_local.end.head._0_1_;
        }
        Frag::Frag((Frag *)&a_local.end.tail,begin,PVar3,(bool)(local_99 & 1));
      }
    }
  }
  FVar4.end.tail = local_10;
  FVar4._0_8_ = a_local._8_8_;
  FVar4._12_4_ = uStack_c;
  return FVar4;
}

Assistant:

Frag Compiler::Alt(Frag a, Frag b) {
  // Special case for convenience in loops.
  if (IsNoMatch(a))
    return b;
  if (IsNoMatch(b))
    return a;

  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();

  inst_[id].InitAlt(a.begin, b.begin);
  return Frag(id, PatchList::Append(inst_.data(), a.end, b.end),
              a.nullable || b.nullable);
}